

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_impl.h
# Opt level: O0

uint64_t safe_sub_uint64_int32(uint64_t a,int32_t b)

{
  uint64_t uVar1;
  int in_ESI;
  char *in_RDI;
  uint64_t result;
  uint64_t tmp;
  char *in_stack_ffffffffffffffe0;
  char *local_8;
  
  if (in_ESI < 0) {
    in_stack_ffffffffffffffe0 = in_RDI;
    uVar1 = safe_abs64((long)in_ESI);
    local_8 = in_RDI + uVar1;
    if (local_8 < in_stack_ffffffffffffffe0) goto LAB_0018f02e;
  }
  else {
    if (in_RDI < (char *)(long)in_ESI) {
LAB_0018f02e:
      safe_math_fail(in_stack_ffffffffffffffe0);
    }
    local_8 = in_RDI + -(long)in_ESI;
  }
  return (uint64_t)local_8;
}

Assistant:

static inline uint64_t safe_sub_uint64_int32(uint64_t a, int32_t b)
{
    // lhs is an uint64_t, rhs signed
    // must first see if rhs is positive or negative
    if (b >= 0)
    {
        if ((uint64_t)b <= a)
        {
            return (uint64_t)(a - (uint64_t)b);
        }
    }
    else
    {
        uint64_t tmp = a;
        // we're now effectively adding
        uint64_t result = a + safe_abs64(b);

        if (result >= tmp)
            return result;
    }

    safe_math_fail("safe_math_fail safe_sub_uint64_int32");
}